

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf-type.c
# Opt level: O0

int basic_type_init(coda_cdf_type *type,int32_t data_type,int32_t num_elements)

{
  int iVar1;
  coda_type_number *pcVar2;
  coda_type_text *pcVar3;
  int64_t local_30;
  int64_t byte_size;
  coda_native_type native_type;
  coda_type_class type_class;
  int32_t num_elements_local;
  int32_t data_type_local;
  coda_cdf_type *type_local;
  
  switch(data_type) {
  case 1:
  case 0x29:
    byte_size._4_4_ = coda_integer_class;
    byte_size._0_4_ = coda_native_type_int8;
    local_30 = 1;
    break;
  case 2:
    byte_size._4_4_ = coda_integer_class;
    byte_size._0_4_ = coda_native_type_int16;
    local_30 = 2;
    break;
  default:
    coda_set_error(-100,"invalid CDF data type (%d)",(ulong)(uint)data_type);
    return -1;
  case 4:
    byte_size._4_4_ = coda_integer_class;
    byte_size._0_4_ = coda_native_type_int32;
    local_30 = 4;
    break;
  case 8:
    byte_size._4_4_ = coda_integer_class;
    byte_size._0_4_ = coda_native_type_int64;
    local_30 = 8;
    break;
  case 0xb:
    byte_size._4_4_ = coda_integer_class;
    byte_size._0_4_ = coda_native_type_uint8;
    local_30 = 1;
    break;
  case 0xc:
    byte_size._4_4_ = coda_integer_class;
    byte_size._0_4_ = coda_native_type_uint16;
    local_30 = 2;
    break;
  case 0xe:
    byte_size._4_4_ = coda_integer_class;
    byte_size._0_4_ = coda_native_type_uint32;
    local_30 = 4;
    break;
  case 0x15:
  case 0x2c:
    byte_size._4_4_ = coda_real_class;
    byte_size._0_4_ = coda_native_type_float;
    local_30 = 4;
    break;
  case 0x16:
  case 0x2d:
    byte_size._4_4_ = coda_real_class;
    byte_size._0_4_ = coda_native_type_double;
    local_30 = 8;
    break;
  case 0x33:
  case 0x34:
    byte_size._4_4_ = coda_text_class;
    if (num_elements == 1) {
      byte_size._0_4_ = coda_native_type_char;
    }
    else {
      byte_size._0_4_ = coda_native_type_string;
    }
    local_30 = (int64_t)num_elements;
  }
  if (byte_size._4_4_ - coda_integer_class < 2) {
    pcVar2 = coda_type_number_new(coda_format_cdf,byte_size._4_4_);
    type->definition = (coda_type *)pcVar2;
  }
  else {
    if (byte_size._4_4_ != coda_text_class) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                    ,0xa5,"int basic_type_init(coda_cdf_type *, int32_t, int32_t)");
    }
    pcVar3 = coda_type_text_new(coda_format_cdf);
    type->definition = (coda_type *)pcVar3;
  }
  if (type->definition == (coda_type *)0x0) {
    type_local._4_4_ = -1;
  }
  else {
    iVar1 = coda_type_set_read_type(type->definition,(coda_native_type)byte_size);
    if (iVar1 == 0) {
      iVar1 = coda_type_set_byte_size(type->definition,local_30);
      if (iVar1 == 0) {
        type_local._4_4_ = 0;
      }
      else {
        type_local._4_4_ = -1;
      }
    }
    else {
      type_local._4_4_ = -1;
    }
  }
  return type_local._4_4_;
}

Assistant:

static int basic_type_init(coda_cdf_type *type, int32_t data_type, int32_t num_elements)
{
    coda_type_class type_class;
    coda_native_type native_type;
    int64_t byte_size;

    switch (data_type)
    {
        case 1:        /* INT1 */
        case 41:       /* BYTE */
            type_class = coda_integer_class;
            native_type = coda_native_type_int8;
            byte_size = 1;
            break;
        case 2:        /* INT2 */
            type_class = coda_integer_class;
            native_type = coda_native_type_int16;
            byte_size = 2;
            break;
        case 4:        /* INT4 */
            type_class = coda_integer_class;
            native_type = coda_native_type_int32;
            byte_size = 4;
            break;
        case 8:        /* INT8 */
            type_class = coda_integer_class;
            native_type = coda_native_type_int64;
            byte_size = 8;
            break;
        case 11:       /* UINT1 */
            type_class = coda_integer_class;
            native_type = coda_native_type_uint8;
            byte_size = 1;
            break;
        case 12:       /* UINT2 */
            type_class = coda_integer_class;
            native_type = coda_native_type_uint16;
            byte_size = 2;
            break;
        case 14:       /* UINT4 */
            type_class = coda_integer_class;
            native_type = coda_native_type_uint32;
            byte_size = 4;
            break;
        case 21:       /* REAL4 */
        case 44:       /* FLOAT */
            type_class = coda_real_class;
            native_type = coda_native_type_float;
            byte_size = 4;
            break;
        case 22:       /* REAL8 */
        case 45:       /* DOUBLE */
            type_class = coda_real_class;
            native_type = coda_native_type_double;
            byte_size = 8;
            break;
        case 51:       /* CHAR */
        case 52:       /* UCHAR */
            type_class = coda_text_class;
            if (num_elements == 1)
            {
                native_type = coda_native_type_char;
            }
            else
            {
                native_type = coda_native_type_string;
            }
            byte_size = num_elements;
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid CDF data type (%d)", data_type);
            return -1;
    }
    switch (type_class)
    {
        case coda_integer_class:
        case coda_real_class:
            type->definition = (coda_type *)coda_type_number_new(coda_format_cdf, type_class);
            break;
        case coda_text_class:
            type->definition = (coda_type *)coda_type_text_new(coda_format_cdf);
            break;
        default:
            assert(0);
            exit(1);
    }
    if (type->definition == NULL)
    {
        return -1;
    }
    if (coda_type_set_read_type(type->definition, native_type) != 0)
    {
        return -1;
    }
    if (coda_type_set_byte_size(type->definition, byte_size) != 0)
    {
        return -1;
    }
    return 0;
}